

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O3

void __thiscall anon_func::WriteUpdater::~WriteUpdater(WriteUpdater *this)

{
  pointer pTVar1;
  
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>).
           super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.
           super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::Task,_std::allocator<wasm::Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>
                                          ).
                                          super_PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>
                                          .
                                          super_Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::Task,_std::allocator<wasm::Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  ::wasm::Pass::~Pass((Pass *)this);
  operator_delete(this,0x130);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }